

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O1

void dcbz_common(CPUPPCState_conflict2 *env,target_ulong addr,uint32_t opcode,_Bool epid,
                uintptr_t retaddr)

{
  bool bVar1;
  void *__s;
  undefined7 in_register_00000009;
  int mmu_idx;
  ulong uVar2;
  size_t __n;
  ulong uVar3;
  ulong addr_00;
  
  mmu_idx = 9;
  if ((int)CONCAT71(in_register_00000009,epid) == 0) {
    mmu_idx = env->dmmu_idx;
  }
  __n = (size_t)env->dcache_line_size;
  if ((((opcode >> 0x15 & 1) == 0) && (env->excp_model == POWERPC_EXCP_970)) &&
     ((env->spr[0x3f6] & 0x180) == 0x80)) {
    __n = 0x20;
  }
  addr_00 = addr & -__n;
  if ((-__n & env->reserve_addr) == addr_00) {
    env->reserve_addr = 0xffffffffffffffff;
  }
  __s = probe_access_ppc64(env,addr_00,(int)__n,MMU_DATA_STORE,mmu_idx,retaddr);
  if (__s != (void *)0x0) {
    memset(__s,0,__n);
    return;
  }
  if (__n != 0) {
    uVar2 = 0;
    uVar3 = 8;
    do {
      cpu_stq_mmuidx_ra_ppc64(env,uVar2 + addr_00,0,mmu_idx,retaddr);
      bVar1 = uVar3 < __n;
      uVar2 = uVar3;
      uVar3 = (ulong)((int)uVar3 + 8);
    } while (bVar1);
  }
  return;
}

Assistant:

static void dcbz_common(CPUPPCState *env, target_ulong addr,
                        uint32_t opcode, bool epid, uintptr_t retaddr)
{
    target_ulong mask, dcbz_size = env->dcache_line_size;
    uint32_t i;
    void *haddr;
    int mmu_idx = epid ? PPC_TLB_EPID_STORE : env->dmmu_idx;

#if defined(TARGET_PPC64)
    /* Check for dcbz vs dcbzl on 970 */
    if (env->excp_model == POWERPC_EXCP_970 &&
        !(opcode & 0x00200000) && ((env->spr[SPR_970_HID5] >> 7) & 0x3) == 1) {
        dcbz_size = 32;
    }
#endif

    /* Align address */
    mask = ~(dcbz_size - 1);
    addr &= mask;

    /* Check reservation */
    if ((env->reserve_addr & mask) == addr)  {
#ifdef _MSC_VER
        env->reserve_addr = (target_ulong)(0ULL - 1ULL);
#else
        env->reserve_addr = (target_ulong)-1ULL;
#endif
    }

    /* Try fast path translate */
    haddr = probe_write(env, addr, dcbz_size, mmu_idx, retaddr);
    if (haddr) {
        memset(haddr, 0, dcbz_size);
    } else {
        /* Slow path */
        for (i = 0; i < dcbz_size; i += 8) {
            cpu_stq_mmuidx_ra(env, addr + i, 0, mmu_idx, retaddr);
        }
    }
}